

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::WorkGroupIDCase::WorkGroupIDCase(WorkGroupIDCase *this,Context *context)

{
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  *this_00;
  uint uVar1;
  UVec3 local_50;
  UVec3 local_44;
  SubCase local_38;
  
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (&this->super_ComputeBuiltinVarCase,context,"work_group_id","gl_WorkGroupID",
             TYPE_UINT_VEC3);
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_01e62780;
  local_44.m_data._0_8_ = &DAT_100000001;
  uVar1 = 1;
  local_50.m_data._0_8_ = &DAT_100000001;
  local_50.m_data[2] = uVar1;
  local_44.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  this_00 = &(this->super_ComputeBuiltinVarCase).m_subCases;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  local_44.m_data._0_8_ = &DAT_100000001;
  local_50.m_data[0] = 0x34;
  local_50.m_data[1] = 1;
  local_50.m_data[2] = uVar1;
  local_44.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  local_44.m_data._0_8_ = &DAT_100000001;
  local_50.m_data[0] = 1;
  local_50.m_data[1] = 0x27;
  local_50.m_data[2] = uVar1;
  local_44.m_data[2] = uVar1;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  local_44.m_data._0_8_ = &DAT_100000001;
  local_44.m_data[2] = 1;
  local_50.m_data._0_8_ = &DAT_100000001;
  local_50.m_data[2] = 0x4e;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  local_44.m_data._0_8_ = &DAT_100000001;
  local_44.m_data[2] = 1;
  local_50.m_data[0] = 4;
  local_50.m_data[1] = 7;
  local_50.m_data[2] = 0xb;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  local_44.m_data[0] = 2;
  local_44.m_data[1] = 3;
  local_44.m_data[2] = 4;
  local_50.m_data[0] = 4;
  local_50.m_data[1] = 7;
  local_50.m_data[2] = 0xb;
  ComputeBuiltinVarCase::SubCase::SubCase(&local_38,&local_44,&local_50);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>(this_00,&local_38);
  return;
}

Assistant:

WorkGroupIDCase (Context& context)
		: ComputeBuiltinVarCase(context, "work_group_id", "gl_WorkGroupID", TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(52,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,39,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,78)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(4,7,11)));
		m_subCases.push_back(SubCase(UVec3(2,3,4), UVec3(4,7,11)));
	}